

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_catch(CHAR_DATA *ch,CHAR_DATA *victim,OBJ_DATA *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA *in_RDI;
  int chance;
  int in_stack_000000bc;
  CHAR_DATA *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *default_name;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((bVar1) ||
     (bVar1 = style_check((int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), bVar1)) {
    iVar2 = get_skill(in_stack_000000c0,in_stack_000000bc);
    if (iVar2 == 0) {
      bVar1 = false;
    }
    else {
      pOVar4 = get_eq_char(in_RDI,0xb);
      if (((pOVar4 == (OBJ_DATA *)0x0) &&
          (pOVar4 = get_eq_char(in_RDI,0x12), pOVar4 == (OBJ_DATA *)0x0)) ||
         (pOVar4 = get_eq_char(in_RDI,0x10), pOVar4 == (OBJ_DATA *)0x0)) {
        bVar1 = can_see_obj((CHAR_DATA *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (OBJ_DATA *)in_RDI);
        if (bVar1) {
          iVar3 = number_percent();
          if ((double)iVar3 <= (double)iVar2 * 0.9) {
            ch_00 = in_RDI;
            weapon_name_lookup(in_stack_fffffffffffffffc,(char *)in_RDI);
            act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            default_name = ch_00;
            weapon_name_lookup(in_stack_fffffffffffffffc,(char *)ch_00);
            act(in_stack_ffffffffffffffd0,ch_00,in_RDI,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            weapon_name_lookup(in_stack_fffffffffffffffc,(char *)default_name);
            act((char *)default_name,ch_00,in_RDI,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            bVar1 = true;
          }
          else {
            act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool check_catch(CHAR_DATA *ch, CHAR_DATA *victim, OBJ_DATA *obj)
{
	int chance = 0;

	if (!is_npc(ch))
	{
		if (!style_check(gsn_catch, ch->pcdata->style))
			return false;
	}

	chance = get_skill(ch, gsn_catch);

	if (chance == 0)
		return false;

	if ((get_eq_char(ch, WEAR_SHIELD) != nullptr || get_eq_char(ch, WEAR_DUAL_WIELD) != nullptr)
		&& get_eq_char(ch, WEAR_WIELD) != nullptr)
	{
		return false;
	}

	if (!can_see_obj(ch, obj))
		return false;

	if (number_percent() > (chance * .9))
	{
		act("You attempt to grab $N's disarmed weapon, but fail to catch it.", ch, 0, victim, TO_CHAR);
		act("$n tries to catch your weapon as it falls to the ground.", ch, 0, victim, TO_VICT);
		act("$n attempts to grab for $N's disarmed weapon, but fails to catch it!", ch, 0, victim, TO_NOTVICT);
		return false;
	}
	else
	{
		act("As $N's $t hurtles through the air, you reach out and catch it!", ch, weapon_name_lookup(obj->value[0]), victim, TO_CHAR);
		act("As your $t hurtles through the air, $n reaches out and catches it in midair!", ch, weapon_name_lookup(obj->value[0]), victim, TO_VICT);
		act("As $N's $t hurtles through the air, $n reaches out and catches it in midair!", ch, weapon_name_lookup(obj->value[0]), victim, TO_NOTVICT);
		return true;
	}
}